

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.h
# Opt level: O2

void VP8YuvToRgba4444(int y,int u,int v,uint8_t *argb)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  iVar1 = VP8YUVToR(y,v);
  uVar2 = VP8YUVToG(y,u,v);
  iVar3 = VP8YUVToB(y,u);
  *argb = (byte)(uVar2 >> 4) | (byte)iVar1 & 0xf0;
  argb[1] = (byte)iVar3 | 0xf;
  return;
}

Assistant:

static WEBP_INLINE void VP8YuvToRgba4444(int y, int u, int v,
                                         uint8_t* const argb) {
  const int r = VP8YUVToR(y, v);        // 4 usable bits
  const int g = VP8YUVToG(y, u, v);     // 4 usable bits
  const int b = VP8YUVToB(y, u);        // 4 usable bits
  const int rg = (r & 0xf0) | (g >> 4);
  const int ba = (b & 0xf0) | 0x0f;     // overwrite the lower 4 bits
#if (WEBP_SWAP_16BIT_CSP == 1)
  argb[0] = ba;
  argb[1] = rg;
#else
  argb[0] = rg;
  argb[1] = ba;
#endif
}